

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageHandler.cpp
# Opt level: O3

PDFFormXObject * __thiscall
JPEGImageHandler::CreateFormXObjectFromJPGStream
          (JPEGImageHandler *this,IByteReaderWithPosition *inJPGStream,ObjectIDType inFormXObjectID)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  Trace *pTVar3;
  IndirectObjectsReferenceRegistry *this_00;
  ObjectIDType inImageXObjectID;
  PDFImageXObject *inImageXObject;
  PDFFormXObject *pPVar4;
  char *inFormat;
  JPEGImageInformation imageInformation;
  JPEGImageParser jpgImageParser;
  JPEGImageInformation local_280;
  JPEGImageParser local_220;
  
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    pTVar3 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar3,
                      "JPEGImageHandler::CreateImageXObjectFromJPGStream. Unexpected Error, mDocumentContex not initialized with a document context"
                     );
  }
  else {
    JPEGImageParser::JPEGImageParser(&local_220);
    JPEGImageInformation::JPEGImageInformation(&local_280);
    iVar1 = (*(inJPGStream->super_IByteReader)._vptr_IByteReader[6])(inJPGStream);
    EVar2 = JPEGImageParser::Parse(&local_220,inJPGStream,&local_280);
    if (EVar2 == eSuccess) {
      (*(inJPGStream->super_IByteReader)._vptr_IByteReader[4])
                (inJPGStream,CONCAT44(extraout_var,iVar1));
      this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
      inImageXObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      inImageXObject =
           CreateAndWriteImageXObjectFromJPGInformation
                     (this,inJPGStream,inImageXObjectID,&local_280);
      if (inImageXObject != (PDFImageXObject *)0x0) {
        pPVar4 = CreateImageFormXObjectFromImageXObject
                           (this,inImageXObject,inFormXObjectID,&local_280);
        if (pPVar4 == (PDFFormXObject *)0x0) {
          pTVar3 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar3,
                            "JPEGImageHandler::CreateImageXObjectFromJPGStream, unable to create form xobject"
                           );
        }
        JPEGImageParser::~JPEGImageParser(&local_220);
        PDFImageXObject::~PDFImageXObject(inImageXObject);
        goto LAB_001ba2b0;
      }
      pTVar3 = Trace::DefaultTrace();
      inFormat = "JPEGImageHandler::CreateFormXObjectFromJPGStream, unable to create image xobject";
    }
    else {
      pTVar3 = Trace::DefaultTrace();
      inFormat = "JPEGImageHandler::CreateImageXObjectFromJPGStream. Failed to parse JPG stream";
    }
    Trace::TraceToLog(pTVar3,inFormat);
    JPEGImageParser::~JPEGImageParser(&local_220);
  }
  pPVar4 = (PDFFormXObject *)0x0;
  inImageXObject = (PDFImageXObject *)0x0;
LAB_001ba2b0:
  operator_delete(inImageXObject,0x20);
  return pPVar4;
}

Assistant:

PDFFormXObject* JPEGImageHandler::CreateFormXObjectFromJPGStream(IByteReaderWithPosition* inJPGStream,ObjectIDType inFormXObjectID)
{
	PDFFormXObject* imageFormXObject = NULL;
	PDFImageXObject* imageXObject = NULL;

	do
	{
		if(!mObjectsContext)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream. Unexpected Error, mDocumentContex not initialized with a document context");
			break;
		}

		JPEGImageParser jpgImageParser;
		JPEGImageInformation imageInformation;

		LongFilePositionType recordedPosition = inJPGStream->GetCurrentPosition();

		EStatusCode status = jpgImageParser.Parse(inJPGStream,imageInformation);
		if(status != PDFHummus::eSuccess)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream. Failed to parse JPG stream");
			break;
		}

		// reset image position after parsing header, for later content copying
		inJPGStream->SetPosition(recordedPosition);

		imageXObject = CreateAndWriteImageXObjectFromJPGInformation(inJPGStream,mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID(),imageInformation);
		if(!imageXObject)
		{
			TRACE_LOG("JPEGImageHandler::CreateFormXObjectFromJPGStream, unable to create image xobject");
			break;
		}

		// Write Image form XObject
		imageFormXObject = CreateImageFormXObjectFromImageXObject(imageXObject,inFormXObjectID,imageInformation);
		if(!imageFormXObject)
		{
			TRACE_LOG("JPEGImageHandler::CreateImageXObjectFromJPGStream, unable to create form xobject");
			break;
		}

	} while(false);

	delete imageXObject;
	return imageFormXObject;
}